

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

void my_emit_message(j_common_ptr cinfo,int msg_level)

{
  jpeg_error_mgr *pjVar1;
  
  pjVar1 = cinfo->err;
  (*pjVar1[2].reset_error_mgr)(cinfo);
  if ((msg_level < 0) && (pjVar1[2].msg_code = 1, pjVar1[2].msg_parm.i[0] != 0)) {
    longjmp((__jmp_buf_tag *)(pjVar1 + 1),1);
  }
  return;
}

Assistant:

static void my_emit_message(j_common_ptr cinfo, int msg_level)
{
  my_error_ptr myerr = (my_error_ptr)cinfo->err;

  myerr->emit_message(cinfo, msg_level);
  if (msg_level < 0) {
    myerr->warning = TRUE;
    if (myerr->stopOnWarning) longjmp(myerr->setjmp_buffer, 1);
  }
}